

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O2

xmlEntityPtr xmlGetDtdEntity(xmlDocPtr doc,xmlChar *name)

{
  xmlHashTablePtr hash;
  xmlEntityPtr pxVar1;
  
  if (((doc != (xmlDocPtr)0x0) && (doc->extSubset != (_xmlDtd *)0x0)) &&
     (hash = (xmlHashTablePtr)doc->extSubset->entities, hash != (xmlHashTablePtr)0x0)) {
    pxVar1 = (xmlEntityPtr)xmlHashLookup3(hash,name,(xmlChar *)0x0,(xmlChar *)0x0);
    return pxVar1;
  }
  return (xmlEntityPtr)0x0;
}

Assistant:

xmlEntityPtr
xmlGetDtdEntity(xmlDocPtr doc, const xmlChar *name) {
    xmlEntitiesTablePtr table;

    if (doc == NULL)
	return(NULL);
    if ((doc->extSubset != NULL) && (doc->extSubset->entities != NULL)) {
	table = (xmlEntitiesTablePtr) doc->extSubset->entities;
	return(xmlGetEntityFromTable(table, name));
    }
    return(NULL);
}